

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_count.cpp
# Opt level: O1

AggregateFunction * duckdb::RegrCountFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType LStack_58;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LogicalType(&LStack_58,UINTEGER);
  AggregateFunction::
  BinaryAggregate<unsigned_long,double,double,unsigned_int,duckdb::RegrCountFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,&LStack_58,in_R8);
  LogicalType::~LogicalType(&LStack_58);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,0,
             (char *)(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                     _M_string_length,0x1e57a52);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

AggregateFunction RegrCountFun::GetFunction() {
	auto regr_count = AggregateFunction::BinaryAggregate<size_t, double, double, uint32_t, RegrCountFunction>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::UINTEGER);
	regr_count.name = "regr_count";
	regr_count.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return regr_count;
}